

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<int,int,float>
               (ImGuiDataType data_type,int *v,float v_speed,int v_min,int v_max,char *format,
               ImGuiSliderFlags flags)

{
  undefined1 auVar1 [16];
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined1 *puVar8;
  byte bVar9;
  uint uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 in_register_00001204 [60];
  undefined1 extraout_var_00 [56];
  undefined1 auVar13 [64];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  float local_7c;
  float local_68;
  undefined8 local_38;
  undefined1 extraout_var [60];
  
  pIVar2 = GImGui;
  auVar16._4_60_ = in_register_00001204;
  auVar16._0_4_ = v_speed;
  auVar16 = ZEXT1664(auVar16._0_16_);
  uVar4 = data_type & 0xfffffffe;
  puVar8 = (undefined1 *)(ulong)(v_max & 0xffffff00);
  if (v_speed == 0.0 && (v_max - v_min != 0 && v_min <= v_max)) {
    auVar16 = ZEXT464((uint)((float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio));
  }
  uVar10 = (flags & 0x100000U) >> 0x14;
  auVar15 = auVar16._0_16_;
  auVar17 = auVar16;
  if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
    bVar3 = IsMousePosValid((ImVec2 *)0x0);
    auVar17 = ZEXT1664(auVar15);
    if (!bVar3) goto LAB_0017feb2;
    bVar3 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5);
    auVar17 = ZEXT1664(auVar15);
    fVar11 = auVar16._0_4_;
    if (!bVar3) goto LAB_0017feb2;
    fVar14 = (pIVar2->IO).NavInputs[(ulong)uVar10 + 0x1d];
    if ((pIVar2->IO).KeyAlt != false) {
      fVar14 = fVar14 * 0.01;
    }
    if ((pIVar2->IO).KeyShift != false) {
      fVar14 = fVar14 * 10.0;
    }
  }
  else {
LAB_0017feb2:
    fVar11 = auVar17._0_4_;
    fVar14 = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar5 = 0;
      if (uVar4 == 8) {
        uVar5 = ImParseFormatPrecision(format,3);
      }
      auVar17._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar17._8_56_ = extraout_var_00;
      local_38 = vmovlps_avx(auVar17._0_16_);
      fVar14 = *(float *)((long)&local_38 + (ulong)uVar10 * 4);
      if ((int)uVar5 < 0) {
        auVar12 = SUB6416(ZEXT464(0x800000),0);
      }
      else if ((int)uVar5 < 10) {
        puVar8 = GetMinimumStepAtDecimalPrecision(int)::min_steps;
        auVar12 = ZEXT416(*(uint *)(GetMinimumStepAtDecimalPrecision(int)::min_steps +
                                   (ulong)uVar5 * 4));
      }
      else {
        auVar13._0_4_ = powf(10.0,(float)(int)-uVar5);
        auVar13._4_60_ = extraout_var;
        auVar12 = auVar13._0_16_;
      }
      auVar1 = vcmpss_avx(auVar12,auVar15,2);
      auVar15 = vblendvps_avx(auVar12,auVar15,auVar1);
      fVar11 = auVar15._0_4_;
    }
  }
  bVar9 = uVar4 == 8 & (byte)((flags & 0x20U) >> 5);
  fVar14 = fVar14 * fVar11;
  if ((flags & 0x100000U) != 0) {
    fVar14 = -fVar14;
  }
  if ((bVar9 != 0) && (v_max - v_min != 0 && v_min <= v_max)) {
    fVar14 = fVar14 / (float)(v_max - v_min);
  }
  if (v_min < v_max) {
    if (v_max <= *v) {
      puVar8 = (undefined1 *)CONCAT71((int7)((ulong)puVar8 >> 8),1);
      iVar6 = (int)puVar8;
      if (0.0 < fVar14) goto LAB_0017fff0;
    }
    iVar6 = (int)CONCAT71((int7)((ulong)puVar8 >> 8),fVar14 < 0.0 && *v <= v_min);
  }
  else {
    iVar6 = 0;
  }
LAB_0017fff0:
  if ((pIVar2->ActiveIdIsJustActivated == false) && ((char)iVar6 == '\0')) {
    if ((fVar14 == 0.0) && (!NAN(fVar14))) goto LAB_0018002a;
    pIVar2->DragCurrentAccum = fVar14 + pIVar2->DragCurrentAccum;
    bVar3 = true;
  }
  else {
    pIVar2->DragCurrentAccum = 0.0;
    bVar3 = false;
  }
  pIVar2->DragCurrentAccumDirty = bVar3;
LAB_0018002a:
  if (pIVar2->DragCurrentAccumDirty == true) {
    iVar7 = *v;
    if (bVar9 == 0) {
      iVar7 = iVar7 + (int)pIVar2->DragCurrentAccum;
      local_7c = 0.0;
      local_68 = 0.0;
    }
    else {
      iVar6 = ImParseFormatPrecision(format,3);
      local_68 = powf(0.1,(float)iVar6);
      local_7c = ScaleRatioFromValueT<int,int,float>(data_type,iVar7,v_min,v_max,true,local_68,0.0);
      iVar6 = 1;
      iVar7 = ScaleValueFromRatioT<int,int,float>
                        (data_type,local_7c + pIVar2->DragCurrentAccum,v_min,v_max,true,local_68,0.0
                        );
    }
    if ((flags & 0x40U) == 0) {
      iVar7 = RoundScalarWithFormatT<int,int>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,iVar7,iVar6);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if (bVar9 == 0) {
      fVar11 = (float)(iVar7 - *v);
    }
    else {
      fVar11 = ScaleRatioFromValueT<int,int,float>(data_type,iVar7,v_min,v_max,true,local_68,0.0);
      fVar11 = fVar11 - local_7c;
    }
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - fVar11;
    iVar6 = *v;
    if ((v_min < v_max) && (iVar6 != iVar7)) {
      if ((iVar7 < v_min) || (((uVar4 != 8 && (iVar6 < iVar7)) && (fVar14 < 0.0)))) {
        iVar7 = v_min;
      }
      if ((v_max < iVar7) || (((uVar4 != 8 && (iVar7 < iVar6)) && (0.0 < fVar14)))) {
        iVar7 = v_max;
      }
    }
    bVar3 = iVar6 != iVar7;
    if (bVar3) {
      *v = iVar7;
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}